

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O2

Instrument *
Timidity::load_instrument
          (Renderer *song,char *name,int percussion,int panning,int note_to_use,int strip_loop,
          int strip_envelope,int strip_tail)

{
  sample_t sVar1;
  byte bVar2;
  BYTE BVar3;
  BYTE BVar4;
  char cVar5;
  short sVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  FileReader *pFVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Instrument *this;
  Sample *pSVar12;
  undefined4 extraout_var_02;
  long lVar13;
  long lVar14;
  sample_t *psVar15;
  undefined4 extraout_var_03;
  _func_int **pp_Var16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  char *pcVar20;
  ulong uVar21;
  sample_t *psVar22;
  Sample *sp;
  bool bVar23;
  bool bVar24;
  FString tmp;
  long local_188;
  GF1PatchData patch_data;
  GF1LayerData layer_data;
  long local_f0;
  undefined1 local_e8 [14];
  char acStack_da [107];
  undefined1 local_6f [22];
  byte local_59;
  
  if (name == (char *)0x0) {
    return (Instrument *)0x0;
  }
  pFVar11 = PathExpander::openFileReader((PathExpander *)pathExpander,name,(int *)0x0);
  if (pFVar11 == (FileReader *)0x0) {
    FString::FString(&tmp,name);
    FString::operator+=(&tmp,".pat");
    pFVar11 = PathExpander::openFileReader((PathExpander *)pathExpander,tmp.Chars,(int *)0x0);
    if (pFVar11 == (FileReader *)0x0) {
      FString::ToUpper(&tmp);
      pFVar11 = PathExpander::openFileReader((PathExpander *)pathExpander,tmp.Chars,(int *)0x0);
      bVar23 = pFVar11 == (FileReader *)0x0;
    }
    else {
      bVar23 = false;
    }
    FString::~FString(&tmp);
    if (bVar23) {
      cmsg(2,0,"Instrument `%s\' can\'t be found.\n",name);
      return (Instrument *)0x0;
    }
  }
  cmsg(0,2,"Loading instrument %s\n",name);
  iVar8 = (*(pFVar11->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar11,&local_f0,0x81);
  if (CONCAT44(extraout_var,iVar8) == 0x81) {
    if (local_f0 != 0x4843544150314647) {
      pcVar20 = "%s: Not an instrument.\n";
      goto LAB_0036be55;
    }
    iVar8 = memcmp(local_e8,"110",4);
    if (iVar8 < 0) {
      pcVar20 = "%s: Is an old and unsupported patch version.\n";
      goto LAB_0036be55;
    }
    iVar8 = (*(pFVar11->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar11,local_6f,0x3f);
    if (CONCAT44(extraout_var_00,iVar8) != 0x3f) goto LAB_0036be4e;
    if ((byte)acStack_da[0x3c] < 2) {
      if (1 < local_59) {
        pcVar20 = "Can\'t handle instruments with %d layers.\n";
        goto LAB_0036b81c;
      }
      iVar8 = (*(pFVar11->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar11,&layer_data,0x2f);
      BVar3 = layer_data.Samples;
      if (CONCAT44(extraout_var_01,iVar8) != 0x2f) goto LAB_0036be4e;
      if (layer_data.Samples != '\0') {
        this = (Instrument *)operator_new(0x10);
        this->sample = (Sample *)0x0;
        this->samples = (uint)BVar3;
        pSVar12 = (Sample *)safe_malloc((ulong)(uint)BVar3 * 0x68);
        this->sample = pSVar12;
        memset(pSVar12,0,(ulong)layer_data.Samples * 0x68);
        local_188 = 0x22;
        for (uVar21 = 0; pp_Var16 = (pFVar11->super_FileReaderBase)._vptr_FileReaderBase,
            uVar21 < layer_data.Samples; uVar21 = uVar21 + 1) {
          iVar8 = (*pp_Var16[2])(pFVar11,&patch_data,0x60);
          if (CONCAT44(extraout_var_02,iVar8) != 0x60) goto LAB_0036be72;
          pSVar12 = this->sample;
          pSVar12[uVar21].data_length = patch_data.WaveSize;
          pSVar12[uVar21].loop_start = patch_data.StartLoop;
          pSVar12[uVar21].loop_end = patch_data.EndLoop;
          pSVar12[uVar21].sample_rate = (uint)patch_data.SampleRate;
          pSVar12[uVar21].low_freq = (float)patch_data.LowFrequency;
          pSVar12[uVar21].high_freq = (float)patch_data.HighFrequency + 0.9999;
          pSVar12[uVar21].root_freq = (float)patch_data.RootFrequency;
          pSVar12[uVar21].high_vel = '\x7f';
          pSVar12[uVar21].type = '\0';
          pSVar12[uVar21].velocity = -1;
          sVar6 = (short)(((percussion & 0x7fU) * 1000) / 0x7f);
          if (percussion == -1) {
            sVar6 = (short)(((patch_data.Balance & 0xf) * 1000) / 0xf);
          }
          sp = pSVar12 + uVar21;
          sp->panning = sVar6 + -500;
          Renderer::compute_pan((double)(int)sVar6 * 0.001,0,&sp->left_offset,&sp->right_offset);
          BVar4 = patch_data.TremoloDepth;
          BVar3 = patch_data.TremoloRate;
          if (patch_data.TremoloDepth == '\0' || patch_data.TremoloRate == '\0') {
            sp->tremolo_sweep_increment = 0;
            sp->tremolo_phase_increment = 0;
            sp->tremolo_depth = '\0';
            cmsg(0,3," * no tremolo\n");
          }
          else {
            uVar9 = convert_tremolo_sweep(song,patch_data.TremoloSweep);
            sp->tremolo_sweep_increment = uVar9;
            uVar18 = convert_tremolo_rate(song,BVar3);
            sp->tremolo_phase_increment = uVar18;
            sp->tremolo_depth = BVar4;
            cmsg(0,3," * tremolo: sweep %d, phase %d, depth %d\n",(ulong)uVar9,(ulong)uVar18,
                 (ulong)BVar4);
          }
          BVar3 = patch_data.VibratoDepth;
          if (patch_data.VibratoDepth == '\0' || patch_data.VibratoRate == '\0') {
            sp->vibrato_sweep_increment = 0;
            sp->vibrato_control_ratio = 0;
            sp->vibrato_depth = '\0';
            cmsg(0,3," * no vibrato\n");
          }
          else {
            uVar18 = (uint)((song->rate * 38.0) / (float)((uint)patch_data.VibratoRate << 6));
            sp->vibrato_control_ratio = uVar18;
            uVar9 = convert_vibrato_sweep(song,patch_data.VibratoSweep,uVar18);
            sp->vibrato_sweep_increment = uVar9;
            sp->vibrato_depth = BVar3;
            cmsg(0,3," * vibrato: sweep %d, ctl %d, depth %d\n",(ulong)uVar9,(ulong)uVar18,
                 (ulong)BVar3);
          }
          sp->modes = (ushort)patch_data.Modes;
          if (panning == -1) {
            sp->scale_note = patch_data.ScaleFrequency;
            sp->scale_factor = patch_data.ScaleFactor;
            if (patch_data.ScaleFactor < 3) {
              sp->scale_factor = patch_data.ScaleFactor << 10;
              uVar7 = patch_data.ScaleFactor << 10;
            }
            else {
              uVar7 = patch_data.ScaleFactor;
              if (0x800 < patch_data.ScaleFactor) {
                sp->scale_factor = 0x400;
                goto LAB_0036bb45;
              }
            }
            if (uVar7 != 0x400) {
              cmsg(0,3," * Scale: note %d, factor %d\n",(ulong)(uint)(int)patch_data.ScaleFrequency,
                   (ulong)uVar7);
            }
          }
          else {
            sp->scale_note = (SWORD)panning;
            sp->scale_factor = 0;
          }
LAB_0036bb45:
          lVar14 = -0x3c;
          do {
            lVar13 = lVar14;
            if (lVar13 == 0) break;
            lVar14 = lVar13 + 1;
          } while (acStack_da[lVar13 + 0x3c] == '\0');
          if (((note_to_use == 1) && ((sp->modes & 0x3c) != 0)) &&
             (cmsg(0,3," - Removing loop and/or sustain\n"), lVar13 == 0)) {
            *(byte *)&sp->modes = (byte)sp->modes & 0xc3;
          }
          if ((strip_loop == 1) && (cmsg(0,3," - Removing envelope\n"), lVar13 == 0)) {
            bVar17 = patch_data.EnvelopeOffset[0];
            for (lVar14 = -5; lVar14 != 0; lVar14 = lVar14 + 1) {
              bVar2 = patch_data.EnvelopeOffset[lVar14 + 6];
              if (bVar17 < bVar2) {
                patch_data.EnvelopeOffset[0] = bVar2;
                bVar17 = bVar2;
              }
            }
            for (lVar14 = -6; lVar14 != 0; lVar14 = lVar14 + 1) {
              patch_data.EnvelopeOffset[lVar14] = '?';
              patch_data.EnvelopeOffset[lVar14 + 6] = patch_data.EnvelopeOffset[0];
            }
          }
          for (lVar14 = -6; lVar14 != 0; lVar14 = lVar14 + 1) {
            *(BYTE *)((long)&pSVar12->loop_start + lVar14 + local_188) =
                 patch_data.EnvelopeOffset[lVar14];
            bVar17 = patch_data.EnvelopeOffset[lVar14 + 6];
            if (0xfa < bVar17) {
              bVar17 = 0xfb;
            }
            if (bVar17 < 6) {
              bVar17 = 5;
            }
            *(byte *)((long)&pSVar12->loop_end + lVar14 + local_188 + 2) = bVar17;
          }
          iVar8 = sp->data_length;
          if ((sp->modes & 1) == 0) {
            bVar24 = SBORROW4(iVar8,0x100000);
            iVar10 = -0x100000;
            bVar23 = iVar8 == 0x100000;
          }
          else {
            bVar24 = SBORROW4(iVar8,0x200001);
            iVar10 = -0x200001;
            bVar23 = iVar8 == 0x200001;
          }
          if (!bVar23 && bVar24 == iVar8 + iVar10 < 0) {
LAB_0036be72:
            cmsg(2,0,"Error reading sample %d.\n",uVar21);
            Instrument::~Instrument(this);
            operator_delete(this,0x10);
            (*(pFVar11->super_FileReaderBase)._vptr_FileReaderBase[1])(pFVar11);
            return (Instrument *)0x0;
          }
          psVar15 = (sample_t *)safe_malloc((long)iVar8);
          sp->data = psVar15;
          iVar8 = sp->data_length;
          iVar10 = (*(pFVar11->super_FileReaderBase)._vptr_FileReaderBase[2])
                             (pFVar11,psVar15,(long)iVar8);
          if (CONCAT44(extraout_var_03,iVar10) != (long)iVar8) goto LAB_0036be72;
          convert_sample_data(sp,sp->data);
          if ((sp->modes & 0x10) == 0) {
            iVar8 = sp->data_length;
            iVar10 = sp->loop_start;
            iVar19 = sp->loop_end;
            cVar5 = (char)((sp->modes & 4) >> 2);
          }
          else {
            cmsg(1,0,"Reverse loop in %s\n",name);
            psVar22 = sp->data;
            iVar8 = sp->data_length;
            psVar15 = psVar22 + iVar8;
            for (lVar14 = 0; -(iVar8 / 2) != (int)lVar14; lVar14 = lVar14 + -1) {
              sVar1 = *psVar22;
              *psVar22 = psVar15[lVar14];
              psVar22 = psVar22 + 1;
              psVar15[lVar14] = sVar1;
            }
            *psVar15 = psVar15[-1];
            iVar10 = iVar8 - sp->loop_end;
            iVar19 = iVar8 - sp->loop_start;
            sp->loop_start = iVar10;
            sp->loop_end = iVar19;
            sp->modes = sp->modes & 0xffeb | 4;
            cVar5 = '\x01';
          }
          sp->data_length = iVar8 << 0xc;
          sp->loop_start = (patch_data.Fractions & 0xf) << 8 | iVar10 << 0xc;
          sp->loop_end = (patch_data.Fractions & 0xfffffff0) << 4 | iVar19 << 0xc;
          if (sp->scale_factor == 0 && cVar5 == '\0') {
            pre_resample(song,sp);
          }
          if (strip_envelope == 1) {
            cmsg(0,3," - Stripping tail\n");
            sp->data_length = sp->loop_end;
          }
          local_188 = local_188 + 0x68;
        }
        goto LAB_0036be6a;
      }
      cmsg(2,0,"Instrument has 0 samples.\n");
    }
    else {
      pcVar20 = "Can\'t handle patches with %d instruments.\n";
LAB_0036b81c:
      cmsg(2,0,pcVar20);
    }
  }
  else {
LAB_0036be4e:
    pcVar20 = "%s: Error reading instrument.\n";
LAB_0036be55:
    cmsg(2,0,pcVar20,name);
  }
  this = (Instrument *)0x0;
  pp_Var16 = (pFVar11->super_FileReaderBase)._vptr_FileReaderBase;
LAB_0036be6a:
  (*pp_Var16[1])(pFVar11);
  return this;
}

Assistant:

static Instrument *load_instrument(Renderer *song, const char *name, int percussion,
					int panning, int note_to_use,
					int strip_loop, int strip_envelope,
					int strip_tail)
{
	Instrument *ip;
	Sample *sp;
	FileReader *fp;
	GF1PatchHeader header;
	GF1InstrumentData idata;
	GF1LayerData layer_data;
	GF1PatchData patch_data;
	int i, j;
	bool noluck = false;

	if (!name) return 0;

	/* Open patch file */
	if ((fp = pathExpander.openFileReader(name, NULL)) == NULL)
	{
		/* Try with various extensions */
		FString tmp = name;
		tmp += ".pat";
		if ((fp = pathExpander.openFileReader(tmp, NULL)) == NULL)
		{
#ifdef __unix__			// Windows isn't case-sensitive.
			tmp.ToUpper();
			if ((fp = pathExpander.openFileReader(tmp, NULL)) == NULL)
#endif
			{
				noluck = true;
			}
		}
	}

	if (noluck)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Instrument `%s' can't be found.\n", name);
		return 0;
	}

	cmsg(CMSG_INFO, VERB_NOISY, "Loading instrument %s\n", name);

	/* Read some headers and do cursory sanity checks. */

	if (sizeof(header) != fp->Read(&header, sizeof(header)))
	{
failread:
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Error reading instrument.\n", name);
		delete fp;
		return 0;
	}
	if (strncmp(header.Header, GF1_HEADER_TEXT, HEADER_SIZE - 4) != 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Not an instrument.\n", name);
		delete fp;
		return 0;
	}
	if (strcmp(header.Header + 8, "110") < 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Is an old and unsupported patch version.\n", name);
		delete fp;
		return 0;
	}
	if (sizeof(idata) != fp->Read(&idata, sizeof(idata)))
	{
		goto failread;
	}

	header.WaveForms = LittleShort(header.WaveForms);
	header.MasterVolume = LittleShort(header.MasterVolume);
	header.DataSize = LittleLong(header.DataSize);
	idata.Instrument = LittleShort(idata.Instrument);

	if (header.Instruments != 1 && header.Instruments != 0) /* instruments. To some patch makers, 0 means 1 */
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Can't handle patches with %d instruments.\n", header.Instruments);
		delete fp;
		return 0;
	}

	if (idata.Layers != 1 && idata.Layers != 0) /* layers. What's a layer? */
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Can't handle instruments with %d layers.\n", idata.Layers);
		delete fp;
		return 0;
	}

	if (sizeof(layer_data) != fp->Read(&layer_data, sizeof(layer_data)))
	{
		goto failread;
	}

	if (layer_data.Samples == 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Instrument has 0 samples.\n");
		delete fp;
		return 0;
	}

	ip = new Instrument;
	ip->samples = layer_data.Samples;
	ip->sample = (Sample *)safe_malloc(sizeof(Sample) * layer_data.Samples);
	memset(ip->sample, 0, sizeof(Sample) * layer_data.Samples);
	for (i = 0; i < layer_data.Samples; ++i)
	{
		if (sizeof(patch_data) != fp->Read(&patch_data, sizeof(patch_data)))
		{
fail:
			cmsg(CMSG_ERROR, VERB_NORMAL, "Error reading sample %d.\n", i);
			delete ip;
			delete fp;
			return 0;
		}

		sp = &(ip->sample[i]);

		sp->data_length = LittleLong(patch_data.WaveSize);
		sp->loop_start = LittleLong(patch_data.StartLoop);
		sp->loop_end = LittleLong(patch_data.EndLoop);
		sp->sample_rate = LittleShort(patch_data.SampleRate);
		sp->low_freq = float(LittleLong(patch_data.LowFrequency));
		sp->high_freq = float(LittleLong(patch_data.HighFrequency)) + 0.9999f;
		sp->root_freq = float(LittleLong(patch_data.RootFrequency));
		sp->high_vel = 127;
		sp->velocity = -1;
		sp->type = INST_GUS;

		// Expand to SF2 range.
		if (panning == -1)
		{
			sp->panning = (patch_data.Balance & 0x0F) * 1000 / 15 - 500;
		}
		else
		{
			sp->panning = (panning & 0x7f) * 1000 / 127 - 500;
		}
		song->compute_pan((sp->panning + 500) / 1000.0, INST_GUS, sp->left_offset, sp->right_offset);

		/* tremolo */
		if (patch_data.TremoloRate == 0 || patch_data.TremoloDepth == 0)
		{
			sp->tremolo_sweep_increment = 0;
			sp->tremolo_phase_increment = 0;
			sp->tremolo_depth = 0;
			cmsg(CMSG_INFO, VERB_DEBUG, " * no tremolo\n");
		}
		else
		{
			sp->tremolo_sweep_increment = convert_tremolo_sweep(song, patch_data.TremoloSweep);
			sp->tremolo_phase_increment = convert_tremolo_rate(song, patch_data.TremoloRate);
			sp->tremolo_depth = patch_data.TremoloDepth;
			cmsg(CMSG_INFO, VERB_DEBUG, " * tremolo: sweep %d, phase %d, depth %d\n",
				sp->tremolo_sweep_increment, sp->tremolo_phase_increment, sp->tremolo_depth);
		}

		/* vibrato */
		if (patch_data.VibratoRate == 0 || patch_data.VibratoDepth == 0)
		{
			sp->vibrato_sweep_increment = 0;
			sp->vibrato_control_ratio = 0;
			sp->vibrato_depth = 0;
			cmsg(CMSG_INFO, VERB_DEBUG, " * no vibrato\n");
		}
		else
		{
			sp->vibrato_control_ratio = convert_vibrato_rate(song, patch_data.VibratoRate);
			sp->vibrato_sweep_increment = convert_vibrato_sweep(song, patch_data.VibratoSweep, sp->vibrato_control_ratio);
			sp->vibrato_depth = patch_data.VibratoDepth;
			cmsg(CMSG_INFO, VERB_DEBUG, " * vibrato: sweep %d, ctl %d, depth %d\n",
				sp->vibrato_sweep_increment, sp->vibrato_control_ratio, sp->vibrato_depth);
		}

		sp->modes = patch_data.Modes;

		/* Mark this as a fixed-pitch instrument if such a deed is desired. */
		if (note_to_use != -1)
		{
			sp->scale_note = note_to_use;
			sp->scale_factor = 0;
		}
		else
		{
			sp->scale_note = LittleShort(patch_data.ScaleFrequency);
			sp->scale_factor = LittleShort(patch_data.ScaleFactor);
			if (sp->scale_factor <= 2)
			{
				sp->scale_factor *= 1024;
			}
			else if (sp->scale_factor > 2048)
			{
				sp->scale_factor = 1024;
			}
			if (sp->scale_factor != 1024)
			{
				cmsg(CMSG_INFO, VERB_DEBUG, " * Scale: note %d, factor %d\n",
					sp->scale_note, sp->scale_factor);
			}
		}

#if 0
		/* seashore.pat in the Midia patch set has no Sustain. I don't
		   understand why, and fixing it by adding the Sustain flag to
		   all looped patches probably breaks something else. We do it
		   anyway. */

		if (sp->modes & PATCH_LOOPEN) 
		{
			sp->modes |= PATCH_SUSTAIN;
		}
#endif
		/* [RH] Alas, eawpats has percussion instruments with bad envelopes. :(
		 * (See cymchina.pat for one example of this sadness.)
		 * Do this logic for instruments without a description, only. Hopefully that
		 * catches all the patches that need it without including any extra.
		 */
		for (j = 0; j < DESC_SIZE; ++j)
		{
			if (header.Description[j] != 0)
				break;
		}
		/* Strip any loops and envelopes we're permitted to */
		/* [RH] (But PATCH_BACKWARD isn't a loop flag at all!) */
		if ((strip_loop == 1) && 
			(sp->modes & (PATCH_SUSTAIN | PATCH_LOOPEN | PATCH_BIDIR | PATCH_BACKWARD)))
		{
			cmsg(CMSG_INFO, VERB_DEBUG, " - Removing loop and/or sustain\n");
			if (j == DESC_SIZE)
			{
				sp->modes &= ~(PATCH_SUSTAIN | PATCH_LOOPEN | PATCH_BIDIR | PATCH_BACKWARD);
			}
		}

		if (strip_envelope == 1)
		{
			cmsg(CMSG_INFO, VERB_DEBUG, " - Removing envelope\n");
			/* [RH] The envelope isn't really removed, but this is the way the standard
			 * Gravis patches get that effect: All rates at maximum, and all offsets at
			 * a constant level.
			 */
			if (j == DESC_SIZE)
			{
				int k;
				for (k = 1; k < ENVELOPES; ++k)
				{ /* Find highest offset. */
					if (patch_data.EnvelopeOffset[k] > patch_data.EnvelopeOffset[0])
					{
						patch_data.EnvelopeOffset[0] = patch_data.EnvelopeOffset[k];
					}
				}
				for (k = 0; k < ENVELOPES; ++k)
				{
					patch_data.EnvelopeRate[k] = 63;
					patch_data.EnvelopeOffset[k] = patch_data.EnvelopeOffset[0];
				}
			}
		}

		for (j = 0; j < 6; j++)
		{
			sp->envelope.gf1.rate[j] = patch_data.EnvelopeRate[j];
			/* [RH] GF1NEW clamps the offsets to the range [5,251], so we do too. */
			sp->envelope.gf1.offset[j] = clamp<BYTE>(patch_data.EnvelopeOffset[j], 5, 251);
		}

		/* Then read the sample data */
		if (((sp->modes & PATCH_16) && sp->data_length/2 > MAX_SAMPLE_SIZE) ||
			(!(sp->modes & PATCH_16) && sp->data_length > MAX_SAMPLE_SIZE))
		{
			goto fail;
		}
		sp->data = (sample_t *)safe_malloc(sp->data_length);

		if (sp->data_length != fp->Read(sp->data, sp->data_length))
			goto fail;

		convert_sample_data(sp, sp->data);

		/* Reverse reverse loops and pass them off as normal loops */
		if (sp->modes & PATCH_BACKWARD)
		{
			int t;
			/* The GUS apparently plays reverse loops by reversing the
			   whole sample. We do the same because the GUS does not SUCK. */

			cmsg(CMSG_WARNING, VERB_NORMAL, "Reverse loop in %s\n", name);
			reverse_data((sample_t *)sp->data, 0, sp->data_length);
			sp->data[sp->data_length] = sp->data[sp->data_length - 1];

			t = sp->loop_start;
			sp->loop_start = sp->data_length - sp->loop_end;
			sp->loop_end = sp->data_length - t;

			sp->modes &= ~PATCH_BACKWARD;
			sp->modes |= PATCH_LOOPEN; /* just in case */
		}

		/* Then fractional samples */
		sp->data_length <<= FRACTION_BITS;
		sp->loop_start <<= FRACTION_BITS;
		sp->loop_end <<= FRACTION_BITS;

		/* Adjust for fractional loop points. */
		sp->loop_start |= (patch_data.Fractions & 0x0F) << (FRACTION_BITS-4);
		sp->loop_end   |= (patch_data.Fractions & 0xF0) << (FRACTION_BITS-4-4);

		/* If this instrument will always be played on the same note,
		   and it's not looped, we can resample it now. */
		if (sp->scale_factor == 0 && !(sp->modes & PATCH_LOOPEN))
		{
			pre_resample(song, sp);
		}

		if (strip_tail == 1)
		{
			/* Let's not really, just say we did. */
			cmsg(CMSG_INFO, VERB_DEBUG, " - Stripping tail\n");
			sp->data_length = sp->loop_end;
		}
	}
	delete fp;
	return ip;
}